

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool dg::vr::sameBase(ValueRelations *graph,V val1,V val2)

{
  bool bVar1;
  V pVVar2;
  V in_RDX;
  V in_RSI;
  ValueRelations *in_RDI;
  V val2orig;
  
  do {
    pVVar2 = in_RDX;
    if (in_RSI == (V)0x0) {
      return false;
    }
    while (pVVar2 != (V)0x0) {
      bVar1 = ValueRelations::are<llvm::Value_const*,llvm::Value_const*>
                        (in_RDI,(Value **)in_RSI,(Type)((ulong)pVVar2 >> 0x20),(Value **)in_RDX);
      if (bVar1) {
        return true;
      }
      pVVar2 = getGEPBase(in_RDX);
    }
    in_RSI = getGEPBase(in_RDX);
  } while( true );
}

Assistant:

bool sameBase(const ValueRelations &graph, V val1, V val2) {
    V val2orig = val2;
    while (val1) {
        val2 = val2orig;
        while (val2) {
            if (graph.are(val1, Relations::EQ,
                          val2)) // TODO compare whether indices may equal
                return true;
            val2 = getGEPBase(val2);
        }
        val1 = getGEPBase(val1);
    }
    return false;
}